

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O0

void message_add(char *str,uint16_t type)

{
  message_t *p;
  int iVar1;
  _message_t *p_Var2;
  char *pcVar3;
  message_t *old_tail;
  message_t *m;
  uint16_t type_local;
  char *str_local;
  
  if ((((messages->head != (message_t *)0x0) && (messages->head->type == type)) &&
      (iVar1 = strcmp(messages->head->str,str), iVar1 == 0)) && (messages->head->count != 0xffff)) {
    messages->head->count = messages->head->count + 1;
    return;
  }
  p_Var2 = (_message_t *)mem_zalloc(0x20);
  pcVar3 = string_make(str);
  p_Var2->str = pcVar3;
  p_Var2->type = type;
  p_Var2->count = 1;
  p_Var2->older = messages->head;
  if (messages->head != (message_t *)0x0) {
    messages->head->newer = p_Var2;
  }
  messages->head = p_Var2;
  messages->count = messages->count + 1;
  if (messages->tail == (message_t *)0x0) {
    messages->tail = p_Var2;
  }
  if (messages->max < messages->count) {
    p = messages->tail;
    messages->tail = p->newer;
    messages->tail->older = (_message_t *)0x0;
    mem_free(p->str);
    mem_free(p);
    messages->count = messages->count - 1;
  }
  return;
}

Assistant:

void message_add(const char *str, uint16_t type)
{
	message_t *m;

	if (messages->head &&
	    messages->head->type == type &&
	    streq(messages->head->str, str) &&
	    messages->head->count != (uint16_t)-1) {
		messages->head->count++;
		return;
	}

	m = mem_zalloc(sizeof(message_t));
	m->str = string_make(str);
	m->type = type;
	m->count = 1;
	m->older = messages->head;

	if (messages->head)
		messages->head->newer = m;

	messages->head = m;
	messages->count++;

	if (!messages->tail)
		messages->tail = m;

	if (messages->count > messages->max) {
		message_t *old_tail = messages->tail;

		messages->tail = old_tail->newer;
		messages->tail->older = NULL;
		mem_free(old_tail->str);
		mem_free(old_tail);
		messages->count--;
	}
}